

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

void create_game_windows(void)

{
  undefined4 uVar1;
  wchar_t statusheight;
  
  layout_game_windows();
  uVar1 = 2;
  if (ui_flags.status3 != '\0') {
    uVar1 = 3;
  }
  werase(basewin);
  if (ui_flags.draw_frame == '\0') {
    msgwin = (WINDOW_conflict *)newwin(ui_flags.msgheight,0x50,0);
    mapwin = (WINDOW_conflict *)newwin(0x15,0x50,ui_flags.msgheight,0);
    statuswin = (WINDOW_conflict *)derwin(basewin,uVar1,0x50,ui_flags.msgheight + 0x15,0);
    if (ui_flags.draw_sidebar != '\0') {
      sidebar = (WINDOW_conflict *)derwin(basewin,ui_flags.viewheight,_COLS + -0x50,0,0x50);
    }
  }
  else {
    msgwin = (WINDOW_conflict *)newwin(ui_flags.msgheight,0x50,1);
    mapwin = (WINDOW_conflict *)newwin(0x15,0x50,ui_flags.msgheight + 2,1);
    statuswin = (WINDOW_conflict *)derwin(basewin,uVar1,0x50,ui_flags.msgheight + 0x18,1);
    if (ui_flags.draw_sidebar != '\0') {
      sidebar = (WINDOW_conflict *)derwin(basewin,ui_flags.viewheight,_COLS + -0x53,1,0x52);
    }
    draw_frame();
  }
  keypad(mapwin,1);
  keypad(msgwin,1);
  leaveok(mapwin,0);
  leaveok(msgwin,0);
  leaveok(statuswin,1);
  if (sidebar != (WINDOW_conflict *)0x0) {
    leaveok(sidebar,1);
  }
  ui_flags.ingame = '\x01';
  redraw_game_windows();
  return;
}

Assistant:

void create_game_windows(void)
{
    int statusheight;

    layout_game_windows();
    statusheight = ui_flags.status3 ? 3 : 2;
    
    werase(basewin);
    if (ui_flags.draw_frame) {
	msgwin = newwin(ui_flags.msgheight, COLNO, 1, 1);
	mapwin = newwin(ROWNO, COLNO, ui_flags.msgheight + 2, 1);
	statuswin = derwin(basewin, statusheight, COLNO,
			   ui_flags.msgheight + ROWNO + 3, 1);
	
	if (ui_flags.draw_sidebar)
	    sidebar = derwin(basewin, ui_flags.viewheight, COLS - COLNO - 3, 1, COLNO+2);
	
	draw_frame();
    } else {
	msgwin = newwin(ui_flags.msgheight, COLNO, 0, 0);
	mapwin = newwin(ROWNO, COLNO, ui_flags.msgheight, 0);
	statuswin = derwin(basewin, statusheight, COLNO, ui_flags.msgheight + ROWNO, 0);
	
	if (ui_flags.draw_sidebar)
	    sidebar = derwin(basewin, ui_flags.viewheight, COLS - COLNO, 0, COLNO);
    }
    
    keypad(mapwin, TRUE);
    keypad(msgwin, TRUE);
    leaveok(mapwin, FALSE);
    leaveok(msgwin, FALSE);
    leaveok(statuswin, TRUE);
    if (sidebar)
	leaveok(sidebar, TRUE);
    
    ui_flags.ingame = TRUE;
    redraw_game_windows();
}